

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__io_init(uv__io_t *w,uv__io_cb cb,int fd)

{
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  
  if (in_RSI == 0) {
    __assert_fail("cb != NULL","src/unix/core.c",0x2aa,
                  "void uv__io_init(uv__io_t *, uv__io_cb, int)");
  }
  if (-2 < in_EDX) {
    in_RDI[1] = (long)(in_RDI + 1);
    in_RDI[2] = (long)(in_RDI + 1);
    in_RDI[3] = (long)(in_RDI + 3);
    in_RDI[4] = (long)(in_RDI + 3);
    *in_RDI = in_RSI;
    *(int *)(in_RDI + 6) = in_EDX;
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    *(undefined4 *)(in_RDI + 5) = 0;
    return;
  }
  __assert_fail("fd >= -1","src/unix/core.c",0x2ab,"void uv__io_init(uv__io_t *, uv__io_cb, int)");
}

Assistant:

void uv__io_init(uv__io_t* w, uv__io_cb cb, int fd) {
  assert(cb != NULL);
  assert(fd >= -1);
  QUEUE_INIT(&w->pending_queue);
  QUEUE_INIT(&w->watcher_queue);
  w->cb = cb;
  w->fd = fd;
  w->events = 0;
  w->pevents = 0;

#if defined(UV_HAVE_KQUEUE)
  w->rcount = 0;
  w->wcount = 0;
#endif /* defined(UV_HAVE_KQUEUE) */
}